

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall re2::Compiler::Copy(Compiler *this,Frag arg)

{
  Frag FVar1;
  LogMessageFatal LStack_188;
  
  LogMessageFatal::LogMessageFatal
            (&LStack_188,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc",0x326
            );
  std::operator<<((ostream *)&LStack_188.super_LogMessage.str_,"Compiler::Copy called!");
  LogMessageFatal::~LogMessageFatal(&LStack_188);
  this->failed_ = true;
  FVar1.begin = 0;
  FVar1.end.p = 0;
  return FVar1;
}

Assistant:

Frag Compiler::Copy(Frag arg) {
  // We're using WalkExponential; there should be no copying.
  LOG(DFATAL) << "Compiler::Copy called!";
  failed_ = true;
  return NoMatch();
}